

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# que_remv_modi.cpp
# Opt level: O2

void __thiscall student::findRecord(student *this)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  size_type sVar4;
  char *pcVar5;
  size_t i_1;
  size_t i;
  ulong uVar6;
  char is;
  int num;
  string word;
  stu dis;
  stu temp;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"----------------Find Record--------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.super__Deque_impl_data
      ._M_finish._M_cur ==
      (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.super__Deque_impl_data
      ._M_start._M_cur) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Sorry but there is empty");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"Any key to continue");
    system("pause");
    return;
  }
  std::operator<<((ostream *)&std::cout,"Your want to search with(name->N, ID->I, ranking->R): ");
  std::operator>>((istream *)&std::cin,&is);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  dis.name._M_dataplus._M_p = (pointer)&dis.name.field_2;
  dis.name._M_string_length = 0;
  dis.name.field_2._M_local_buf[0] = '\0';
  dis.ID._M_dataplus._M_p = (pointer)&dis.ID.field_2;
  dis.ID._M_string_length = 0;
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  dis.ID.field_2._M_local_buf[0] = '\0';
  word.field_2._M_local_buf[0] = '\0';
  if (is == 'I') {
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::operator>>((istream *)&std::cin,(string *)&word);
    bVar1 = true;
    uVar6 = 0;
    while( true ) {
      sVar4 = std::deque<stu,_std::allocator<stu>_>::size((deque<stu,_std::allocator<stu>_> *)this);
      if (sVar4 <= uVar6) break;
      stu::stu(&temp,(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur);
      _Var2 = std::operator==(&temp.ID,&word);
      if (_Var2) {
        bVar1 = false;
        stu::operator=(&dis,&temp);
      }
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,&temp);
      stu::~stu(&temp);
      uVar6 = uVar6 + 1;
    }
  }
  else if (is == 'R') {
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::istream::operator>>((istream *)&std::cin,&num);
    bVar1 = true;
    uVar6 = 0;
    while( true ) {
      sVar4 = std::deque<stu,_std::allocator<stu>_>::size((deque<stu,_std::allocator<stu>_> *)this);
      if (sVar4 <= uVar6) break;
      stu::stu(&temp,(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur);
      if (temp.ranking == num) {
        bVar1 = false;
        stu::operator=(&dis,&temp);
      }
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,&temp);
      stu::~stu(&temp);
      uVar6 = uVar6 + 1;
    }
  }
  else {
    if (is != 'N') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_001049f9;
    }
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::operator>>((istream *)&std::cin,(string *)&word);
    bVar1 = true;
    uVar6 = 0;
    while( true ) {
      sVar4 = std::deque<stu,_std::allocator<stu>_>::size((deque<stu,_std::allocator<stu>_> *)this);
      if (sVar4 <= uVar6) break;
      stu::stu(&temp,(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur);
      _Var2 = std::operator==(&temp.name,&word);
      if (_Var2) {
        bVar1 = false;
        stu::operator=(&dis,&temp);
      }
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,&temp);
      stu::~stu(&temp);
      uVar6 = uVar6 + 1;
    }
  }
  if (bVar1) {
    pcVar5 = "Sorry but the student you search is not exist";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"------------------Record-------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"name: ");
    poVar3 = std::operator<<(poVar3,(string *)&dis);
    poVar3 = std::operator<<(poVar3,"    ID: ");
    poVar3 = std::operator<<(poVar3,(string *)&dis.ID);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"class1: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dis.class1);
    poVar3 = std::operator<<(poVar3,"   class2: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dis.class2);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"ranking: ");
    std::ostream::operator<<(poVar3,dis.ranking);
    pcVar5 = "-------------------End---------------------";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Any key to continue");
  system("pause");
LAB_001049f9:
  std::__cxx11::string::~string((string *)&word);
  stu::~stu(&dis);
  return;
}

Assistant:

void student::findRecord(){
    //savedTag("findRecord");
    cout<<"----------------Find Record--------------------"<<endl;
    if(student::students.empty()){
        cout<<"Sorry but there is empty"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    char is;
    cout<<"Your want to search with(name->N, ID->I, ranking->R): ";
    cin >> is; cout<<endl;
    stu dis;            
    string word;
    int num; int flag =1;
    switch(is){
        case 'N':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.name==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'I':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ID==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'R':
            cout<<"Your want to search: ";
            cin>>num;
            for(size_t i=0;i<student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ranking==num){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        default:
            cout<<"Error"<<endl;
            return;
    }
    if(flag){
        cout<<"Sorry but the student you search is not exist"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    cout<<"------------------Record-------------------"<<endl;
    cout<<"name: "<<dis.name<<"    ID: "<<dis.ID<<endl;
    cout<<"class1: "<<dis.class1<<"   class2: "<<dis.class2<<endl;
    cout<<"ranking: "<<dis.ranking;
    cout<<"-------------------End---------------------"<<endl;
    cout<<"Any key to continue";
    system("pause");
    return;
}